

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void bitset_set_list(uint64_t *words,uint16_t *list,uint64_t length)

{
  _Bool _Var1;
  
  _Var1 = croaring_avx2();
  if (_Var1) {
    _asm_bitset_set_list(words,list,length);
    return;
  }
  _scalar_bitset_set_list(words,list,length);
  return;
}

Assistant:

void bitset_set_list(uint64_t *words, const uint16_t *list, uint64_t length) {
    if( croaring_avx2() ) {
        _asm_bitset_set_list(words, list, length);
    } else {
        _scalar_bitset_set_list(words, list, length);
    }
}